

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::read_in_particle_samples_JAM(particleSamples *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  void *pvVar4;
  value_type *__x;
  long in_RDI;
  particle_info temp_particle_info;
  stringstream temp2;
  int ipart;
  stringstream temp1;
  int num_particles;
  int temp_monval;
  int ievent;
  char cdummy;
  int n_particle;
  int event_id;
  string temp_string;
  istream *in_stack_fffffffffffffb98;
  istream *in_stack_fffffffffffffba0;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffffbb8;
  particleSamples *in_stack_fffffffffffffbc0;
  double local_3e8 [2];
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0 [5];
  stringstream local_378 [396];
  int local_1ec;
  void *local_1e8;
  int local_1dc;
  stringstream local_1d8 [408];
  int local_40;
  int local_3c;
  int local_38;
  char local_31;
  int local_30;
  int local_2c;
  string local_28 [40];
  
  clear_out_previous_record(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::__cxx11::string::string(local_28);
  local_38 = 0;
  local_40 = 0;
  do {
    if (*(int *)(in_RDI + 0x5f0) <= local_40) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(in_RDI + 0x1c8),local_28);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1d8,local_28,_Var2);
    piVar3 = std::operator>>((istream *)local_1d8,&local_31);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_2c);
    std::istream::operator>>(piVar3,&local_30);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) == 0) {
      pvVar4 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x1478d2);
      local_1e8 = pvVar4;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffba0,(value_type *)in_stack_fffffffffffffb98);
      for (local_1ec = 0; local_1ec < local_30; local_1ec = local_1ec + 1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)(in_RDI + 0x1c8),local_28);
        _Var2 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_378,local_28,_Var2);
        std::istream::operator>>((istream *)local_378,&local_3c);
        piVar3 = (istream *)std::istream::operator>>((istream *)local_378,local_3e8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&local_3d8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&local_3d0);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&local_3c8);
        __x = (value_type *)std::istream::operator>>(piVar3,&local_3b8);
        in_stack_fffffffffffffba0 = (istream *)std::istream::operator>>((istream *)__x,&local_3b0);
        in_stack_fffffffffffffb98 =
             (istream *)std::istream::operator>>(in_stack_fffffffffffffba0,&local_3a8);
        std::istream::operator>>(in_stack_fffffffffffffb98,local_3a0);
        local_3c0 = sqrt(local_3c8 * local_3c8 +
                         local_3d0 * local_3d0 + local_3e8[0] * local_3e8[0] + local_3d8 * local_3d8
                        );
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       **)(in_RDI + 0x690),(long)local_38);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)piVar3,__x);
        std::__cxx11::stringstream::~stringstream(local_378);
      }
      local_40 = local_30 + local_40;
      local_38 = local_38 + 1;
      local_1dc = 0;
    }
    else {
      local_1dc = 3;
    }
    std::__cxx11::stringstream::~stringstream(local_1d8);
  } while (local_1dc == 0);
  local_1dc = 1;
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_JAM() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int event_id, n_particle;
    char cdummy;
    int ievent = 0;
    int temp_monval;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        getline(inputfile, temp_string);
        std::stringstream temp1(temp_string);
        temp1 >> cdummy >> event_id >> n_particle;

        if (inputfile.eof()) break;

        full_particle_list->push_back(new vector<particle_info>);
        for (int ipart = 0; ipart < n_particle; ipart++) {
            getline(inputfile, temp_string);
            std::stringstream temp2(temp_string);
            temp2 >> temp_monval;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.px
                >> temp_particle_info.py >> temp_particle_info.pz
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.t;
            temp_particle_info.E = sqrt(
                temp_particle_info.mass * temp_particle_info.mass
                + temp_particle_info.px * temp_particle_info.px
                + temp_particle_info.py * temp_particle_info.py
                + temp_particle_info.pz * temp_particle_info.pz);
            temp_particle_info.monval = temp_monval;
            (*full_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}